

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::EvaluateSectionFrame
          (ChElementShellANCF_3443 *this,double xi,double eta,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  ChVector<double> MidsurfaceY;
  ChVector<double> MidsurfaceX;
  VectorN Sxi_eta_compact;
  VectorN Sxi_compact;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  ChVector<double> local_3f8;
  Matrix3xN *local_3e0;
  Matrix3xN *local_3d8;
  VectorN *local_3d0;
  undefined8 local_3c0;
  double local_3a8;
  ChVector<double> local_398;
  VectorN local_380;
  VectorN local_300;
  VectorN local_280;
  Matrix3xN local_200;
  
  dVar10 = this->m_thicknessZ;
  dVar40 = this->m_midsurfoffset;
  Calc_Sxi_compact(this,&local_300,xi,eta,0.0,dVar10,dVar40);
  Calc_Sxi_xi_compact(this,&local_280,xi,eta,0.0,dVar10,dVar40);
  Calc_Sxi_eta_compact(this,&local_380,xi,eta,0.0,dVar10,dVar40);
  CalcCoordMatrix(this,&local_200);
  local_3d8 = (Matrix3xN *)&local_300;
  local_3e0 = &local_200;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>_>
                    *)&local_3e0);
  local_3a8 = this->m_lenX;
  local_3c0 = 0x4000000000000000;
  local_3d8 = &local_200;
  local_3d0 = &local_280;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_398,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_3e0,(type *)0x0);
  local_3a8 = this->m_lenY;
  local_3d0 = &local_380;
  local_3c0 = 0x4000000000000000;
  local_3d8 = &local_200;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_3f8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_3e0,(type *)0x0);
  auVar8 = ZEXT816(0) << 0x40;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_398.m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_398.m_data[2];
  if ((((local_398.m_data[0] != 0.0) || (NAN(local_398.m_data[0]))) || (local_398.m_data[1] != 0.0))
     || (((NAN(local_398.m_data[1]) || (local_398.m_data[2] != 0.0)) || (NAN(local_398.m_data[2]))))
     ) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_398.m_data[1] * local_398.m_data[1];
    auVar8 = vfmadd231sd_fma(auVar14,auVar9,auVar9);
    auVar8 = vfmadd231sd_fma(auVar8,auVar29,auVar29);
    if (auVar8._0_8_ < 0.0) {
      dVar10 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar10 = auVar8._0_8_;
    }
    bVar4 = 2.2250738585072014e-308 <= dVar10;
    dVar10 = 1.0 / dVar10;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)bVar4 * (long)(local_398.m_data[1] * dVar10);
    auVar7._0_8_ = (ulong)bVar4 * (long)(local_398.m_data[0] * dVar10) +
                   (ulong)!bVar4 * 0x3ff0000000000000;
    auVar7._8_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)bVar4 * (long)(local_398.m_data[2] * dVar10);
  }
  else {
    auVar7 = ZEXT816(0x3ff0000000000000);
    auVar6 = ZEXT816(0) << 0x40;
  }
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_3f8.m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_3f8.m_data[0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_3f8.m_data[1];
  dVar37 = auVar8._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_3f8.m_data[1] * dVar37;
  auVar9 = vfmsub231sd_fma(auVar27,auVar6,auVar15);
  dVar10 = auVar9._0_8_;
  dVar39 = auVar7._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar39 * local_3f8.m_data[2];
  auVar29 = vfmsub231sd_fma(auVar41,auVar8,auVar23);
  dVar38 = auVar6._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar38 * local_3f8.m_data[0];
  auVar14 = vfmsub231sd_fma(auVar34,auVar7,auVar26);
  dVar12 = auVar14._0_8_;
  dVar40 = auVar29._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar40 * dVar40;
  auVar9 = vfmadd231sd_fma(auVar16,auVar9,auVar9);
  auVar9 = vfmadd231sd_fma(auVar9,auVar14,auVar14);
  if (auVar9._0_8_ < 0.0) {
    dVar11 = sqrt(auVar9._0_8_);
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar11 = auVar9._0_8_;
  }
  if (0.0001 <= dVar11) goto LAB_00794397;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_3f8.m_data[0];
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar9 = vandpd_avx512vl(auVar24,auVar1);
  if (0.9 <= auVar9._0_8_) {
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_3f8.m_data[1];
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar9 = vandpd_avx512vl(auVar30,auVar2);
    if (0.9 <= auVar9._0_8_) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_3f8.m_data[2];
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar9 = vandpd_avx512vl(auVar31,auVar3);
      auVar29 = ZEXT816(0);
      if (0.9 <= auVar9._0_8_) goto LAB_00794318;
      auVar9 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar29 = ZEXT816(0x3ff0000000000000);
LAB_00794318:
      auVar9 = ZEXT816(0);
    }
    auVar14 = ZEXT816(0) << 0x40;
  }
  else {
    auVar14 = ZEXT816(0x3ff0000000000000);
    auVar9 = ZEXT816(0);
    auVar29 = ZEXT816(0) << 0x40;
  }
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar29._0_8_ * -dVar37;
  auVar15 = vfmadd231sd_fma(auVar28,auVar6,auVar9);
  dVar10 = auVar15._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar9._0_8_ * -dVar39;
  auVar9 = vfmadd231sd_fma(auVar42,auVar8,auVar14);
  dVar40 = auVar9._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar14._0_8_ * -dVar38;
  auVar9 = vfmadd231sd_fma(auVar35,auVar7,auVar29);
  dVar12 = auVar9._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar40 * dVar40;
  auVar29 = vfmadd231sd_fma(auVar17,auVar15,auVar15);
  auVar9 = vfmadd231sd_fma(auVar29,auVar9,auVar9);
  if (auVar9._0_8_ < 0.0) {
    dVar11 = sqrt(auVar9._0_8_);
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar11 = auVar9._0_8_;
  }
LAB_00794397:
  dVar11 = 1.0 / dVar11;
  dVar10 = dVar10 * dVar11;
  dVar40 = dVar40 * dVar11;
  dVar12 = dVar12 * dVar11;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar38 * dVar12;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar40;
  auVar8 = vfmsub231sd_fma(auVar36,auVar43,auVar8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar12;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar37 * dVar10;
  auVar9 = vfmsub231sd_fma(auVar25,auVar18,auVar7);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar10;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar39 * dVar40;
  auVar29 = vfmsub231sd_fma(auVar45,auVar32,auVar6);
  dVar13 = auVar9._0_8_;
  dVar11 = dVar12 + dVar39 + dVar13;
  dVar33 = auVar8._0_8_;
  dVar44 = auVar29._0_8_;
  if (0.0 <= dVar11) {
    dVar11 = dVar11 + 1.0;
    if (dVar11 < 0.0) {
      dVar12 = sqrt(dVar11);
    }
    else {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar11;
      auVar8 = vsqrtsd_avx(auVar19,auVar19);
      dVar12 = auVar8._0_8_;
    }
    dVar13 = dVar12 * 0.5;
    dVar12 = 0.5 / dVar12;
    dVar39 = (dVar44 - dVar40) * dVar12;
    dVar11 = (dVar10 - dVar37) * dVar12;
    dVar12 = (dVar38 - dVar33) * dVar12;
  }
  else {
    cVar5 = dVar39 < dVar13;
    dVar11 = dVar39;
    if ((bool)cVar5) {
      dVar11 = dVar13;
    }
    if (dVar11 < dVar12) {
      cVar5 = '\x02';
    }
    if (cVar5 == '\x02') {
      dVar12 = ((dVar12 - dVar39) - dVar13) + 1.0;
      if (dVar12 < 0.0) {
        dVar13 = sqrt(dVar12);
      }
      else {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar12;
        auVar8 = vsqrtsd_avx(auVar21,auVar21);
        dVar13 = auVar8._0_8_;
      }
      dVar12 = dVar13 * 0.5;
      dVar13 = 0.5 / dVar13;
      dVar39 = (dVar37 + dVar10) * dVar13;
      dVar11 = (dVar40 + dVar44) * dVar13;
      dVar10 = dVar38 - dVar33;
    }
    else if (cVar5 == '\x01') {
      dVar12 = ((dVar13 - dVar12) - dVar39) + 1.0;
      if (dVar12 < 0.0) {
        dVar13 = sqrt(dVar12);
      }
      else {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar12;
        auVar8 = vsqrtsd_avx(auVar20,auVar20);
        dVar13 = auVar8._0_8_;
      }
      dVar11 = dVar13 * 0.5;
      dVar13 = 0.5 / dVar13;
      dVar12 = (dVar40 + dVar44) * dVar13;
      dVar39 = (dVar38 + dVar33) * dVar13;
      dVar10 = dVar10 - dVar37;
    }
    else {
      dVar12 = ((dVar39 - dVar13) - dVar12) + 1.0;
      if (dVar12 < 0.0) {
        dVar13 = sqrt(dVar12);
      }
      else {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar12;
        auVar8 = vsqrtsd_avx(auVar22,auVar22);
        dVar13 = auVar8._0_8_;
      }
      dVar39 = dVar13 * 0.5;
      dVar13 = 0.5 / dVar13;
      dVar11 = (dVar38 + dVar33) * dVar13;
      dVar12 = (dVar37 + dVar10) * dVar13;
      dVar10 = dVar44 - dVar40;
    }
    dVar13 = dVar10 * dVar13;
  }
  rot->m_data[0] = dVar13;
  rot->m_data[1] = dVar39;
  rot->m_data[2] = dVar11;
  rot->m_data[3] = dVar12;
  return;
}

Assistant:

void ChElementShellANCF_3443::EvaluateSectionFrame(const double xi,
                                                   const double eta,
                                                   ChVector<>& point,
                                                   ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> MidsurfaceX = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> MidsurfaceY = e_bar * Sxi_eta_compact * 2 / m_lenY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the shell xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the shell eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(MidsurfaceX, MidsurfaceY);

    rot = msect.Get_A_quaternion();
}